

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.hpp
# Opt level: O1

void __thiscall hta::storage::file::Metric::Metric(Metric *this,path *param_2)

{
  _Rb_tree_header *p_Var1;
  path pStack_38;
  
  (this->super_Metric)._vptr_Metric = (_func_int **)&PTR_meta_001a9c38;
  this->open_mode_ = read;
  Catch::clara::std::filesystem::__cxx11::path::path((path *)&this->path_,param_2);
  path_raw_abi_cxx11_(&pStack_38,this);
  File<hta::storage::file::Metric::Header,_hta::TimeValue>::File(&this->file_raw_,&pStack_38);
  Catch::clara::std::filesystem::__cxx11::path::~path((path *)&pStack_38);
  p_Var1 = &(this->files_hta_)._M_t._M_impl.super__Rb_tree_header;
  (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->files_hta_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

Metric(FileOpenTag::Read file_open_tag, const std::filesystem::path& path)
    : open_mode_(file_open_tag.mode), path_(path), file_raw_(file_open_tag, path_raw())
    {
    }